

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall
wabt::ReturnCallIndirectExpr::ReturnCallIndirectExpr(ReturnCallIndirectExpr *this,Location *loc)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr.super_intrusive_list_base<wabt::Expr>.next_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr.super_intrusive_list_base<wabt::Expr>.prev_
       = (Expr *)0x0;
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__Expr_001923c8;
  pcVar1 = (loc->filename)._M_str;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc.filename._M_len =
       (loc->filename)._M_len;
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc.filename._M_str = pcVar1;
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc.field_1.field_1.offset = sVar2;
  *(undefined8 *)((long)&(this->super_ExprMixin<(wabt::ExprType)41>).super_Expr.loc.field_1 + 8) =
       uVar3;
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr.type_ = ReturnCallIndirect;
  (this->super_ExprMixin<(wabt::ExprType)41>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__ReturnCallIndirectExpr_00193018;
  FuncDeclaration::FuncDeclaration(&this->decl);
  Var::Var(&this->table);
  return;
}

Assistant:

explicit ReturnCallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::ReturnCallIndirect>(loc) {}